

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O2

void __thiscall CEmoticon::DrawCircle(CEmoticon *this,float x,float y,float r,int Segments)

{
  long lVar1;
  IGraphics *pIVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  CFreeformItem Array [32];
  
  fVar10 = (float)Segments;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0;
  do {
    uVar3 = 0;
    do {
      if (Segments <= iVar5) {
        if (uVar3 != 0) {
          pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          (*(pIVar2->super_IInterface)._vptr_IInterface[0x1e])(pIVar2,Array,(ulong)uVar3);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      fVar8 = ((float)iVar5 / fVar10 + (float)iVar5 / fVar10) * 3.1415927;
      fVar11 = (float)(iVar5 + 1) / fVar10;
      iVar5 = iVar5 + 2;
      fVar12 = (fVar11 + fVar11) * 3.1415927;
      fVar9 = ((float)iVar5 / fVar10 + (float)iVar5 / fVar10) * 3.1415927;
      fVar11 = cosf(fVar8);
      fVar6 = cosf(fVar12);
      fVar7 = cosf(fVar9);
      fVar8 = sinf(fVar8);
      fVar12 = sinf(fVar12);
      fVar9 = sinf(fVar9);
      uVar4 = uVar3 + 1;
      Array[(int)uVar3].m_X0 = x;
      Array[(int)uVar3].m_Y0 = y;
      Array[(int)uVar3].m_X1 = fVar11 * r + x;
      Array[(int)uVar3].m_Y1 = fVar8 * r + y;
      Array[(int)uVar3].m_X2 = fVar7 * r + x;
      Array[(int)uVar3].m_Y2 = fVar9 * r + y;
      Array[(int)uVar3].m_X3 = fVar6 * r + x;
      Array[(int)uVar3].m_Y3 = fVar12 * r + y;
      uVar3 = uVar4;
    } while (uVar4 != 0x20);
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x1e])(pIVar2,Array,0x20);
  } while( true );
}

Assistant:

void CEmoticon::DrawCircle(float x, float y, float r, int Segments)
{
	IGraphics::CFreeformItem Array[32];
	int NumItems = 0;
	float FSegments = (float)Segments;
	for(int i = 0; i < Segments; i+=2)
	{
		float a1 = i/FSegments * 2*pi;
		float a2 = (i+1)/FSegments * 2*pi;
		float a3 = (i+2)/FSegments * 2*pi;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		Array[NumItems++] = IGraphics::CFreeformItem(
			x, y,
			x+Ca1*r, y+Sa1*r,
			x+Ca3*r, y+Sa3*r,
			x+Ca2*r, y+Sa2*r);
		if(NumItems == 32)
		{
			m_pClient->Graphics()->QuadsDrawFreeform(Array, 32);
			NumItems = 0;
		}
	}
	if(NumItems)
		m_pClient->Graphics()->QuadsDrawFreeform(Array, NumItems);
}